

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError ValidateParameters(PaStreamParameters *parameters,PaUtilHostApiRepresentation *hostApi,
                          StreamDirection mode)

{
  int iVar1;
  long *plVar2;
  PaError PVar3;
  char *format;
  
  iVar1 = parameters->device;
  if ((long)iVar1 == -2) {
    plVar2 = (long *)parameters->hostApiSpecificStreamInfo;
    PVar3 = -0x2700;
    format = 
    "Expression \'streamInfo->size == sizeof (PaAlsaStreamInfo) && streamInfo->version == 1\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1568\n"
    ;
    if ((*plVar2 == 0x20) && (plVar2[2] == 1)) {
      if (plVar2[3] != 0) {
        return 0;
      }
      PVar3 = -0x270c;
      format = 
      "Expression \'streamInfo->deviceString != NULL\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1569\n"
      ;
    }
  }
  else {
    if ((hostApi->info).deviceCount <= iVar1) {
      __assert_fail("parameters->device < hostApi->info.deviceCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                    ,0x616,
                    "PaError ValidateParameters(const PaStreamParameters *, PaUtilHostApiRepresentation *, StreamDirection)"
                   );
    }
    if (parameters->hostApiSpecificStreamInfo == (void *)0x0) {
      if (hostApi->deviceInfos[iVar1] == (PaDeviceInfo *)0x0) {
        __assert_fail("deviceInfo",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0x627,
                      "PaError ValidateParameters(const PaStreamParameters *, PaUtilHostApiRepresentation *, StreamDirection)"
                     );
      }
      if (parameters->channelCount <=
          (&hostApi->deviceInfos[iVar1]->maxInputChannels)[mode != StreamDirection_In]) {
        return 0;
      }
      PVar3 = -0x270e;
      format = 
      "Expression \'parameters->channelCount <= maxChans\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1579\n"
      ;
    }
    else {
      PVar3 = -0x2709;
      format = 
      "Expression \'parameters->hostApiSpecificStreamInfo == NULL\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1559\n"
      ;
    }
  }
  PaUtil_DebugPrint(format);
  return PVar3;
}

Assistant:

static PaError ValidateParameters( const PaStreamParameters *parameters, PaUtilHostApiRepresentation *hostApi, StreamDirection mode )
{
    PaError result = paNoError;
    int maxChans;
    const PaAlsaDeviceInfo *deviceInfo = NULL;
    assert( parameters );

    if( parameters->device != paUseHostApiSpecificDeviceSpecification )
    {
        assert( parameters->device < hostApi->info.deviceCount );
        PA_UNLESS( parameters->hostApiSpecificStreamInfo == NULL, paBadIODeviceCombination );
        deviceInfo = GetDeviceInfo( hostApi, parameters->device );
    }
    else
    {
        const PaAlsaStreamInfo *streamInfo = parameters->hostApiSpecificStreamInfo;

        PA_UNLESS( parameters->device == paUseHostApiSpecificDeviceSpecification, paInvalidDevice );
        PA_UNLESS( streamInfo->size == sizeof (PaAlsaStreamInfo) && streamInfo->version == 1,
                paIncompatibleHostApiSpecificStreamInfo );
        PA_UNLESS( streamInfo->deviceString != NULL, paInvalidDevice );

        /* Skip further checking */
        return paNoError;
    }

    assert( deviceInfo );
    assert( parameters->hostApiSpecificStreamInfo == NULL );
    maxChans = ( StreamDirection_In == mode ? deviceInfo->baseDeviceInfo.maxInputChannels :
        deviceInfo->baseDeviceInfo.maxOutputChannels );
    PA_UNLESS( parameters->channelCount <= maxChans, paInvalidChannelCount );

error:
    return result;
}